

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::HasBuiltinDecoration
               (DecorationManager *decoration_manager,uint32_t var_id,uint32_t built_in)

{
  bool bVar1;
  anon_class_4_1_92ad5804 local_3c;
  function<bool_(const_spvtools::opt::Instruction_&)> local_38;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t built_in_local;
  uint32_t var_id_local;
  DecorationManager *decoration_manager_local;
  
  local_3c.built_in = built_in;
  local_18 = built_in;
  local_14 = var_id;
  _built_in_local = decoration_manager;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::(anonymous_namespace)::HasBuiltinDecoration(spvtools::opt::analysis::DecorationManager*,unsigned_int,unsigned_int)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_38,&local_3c);
  bVar1 = analysis::DecorationManager::FindDecoration(decoration_manager,var_id,0xb,&local_38);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_38);
  return bVar1;
}

Assistant:

bool HasBuiltinDecoration(analysis::DecorationManager* decoration_manager,
                          uint32_t var_id, uint32_t built_in) {
  return decoration_manager->FindDecoration(
      var_id, uint32_t(spv::Decoration::BuiltIn),
      [built_in](const Instruction& inst) {
        return built_in == inst.GetSingleWordInOperand(
                               kOpDecorateInOperandBuiltinDecoration);
      });
}